

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O2

void __thiscall
glslang::TParseContextBase::rValueErrorCheck
          (TParseContextBase *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_01;
  undefined8 uVar5;
  TIntermTyped *pTVar6;
  long lVar7;
  undefined4 extraout_var_02;
  TString *name;
  undefined4 extraout_var_03;
  char *pcVar8;
  _func_int **pp_Var9;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  long *plVar3;
  undefined4 extraout_var_00;
  
  if (node != (TIntermTyped *)0x0) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[8])(node);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
    if ((*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0xe) & 1) == 0) {
      if ((plVar3 != (long *)0x0) &&
         (((int)plVar3[0x17] - 0x33U < 4 || ((int)plVar3[0x17] == 0x2d7)))) {
        uVar5 = (**(code **)(*plVar3 + 400))(plVar3);
        UNRECOVERED_JUMPTABLE = (this->super_TParseVersions)._vptr_TParseVersions[0x43];
        (*UNRECOVERED_JUMPTABLE)(this,loc,op,uVar5,UNRECOVERED_JUMPTABLE);
        return;
      }
    }
    else {
      local_48 = (code *)0x0;
      uStack_40 = 0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      pTVar6 = TIntermediate::traverseLValueBase
                         (node,true,false,(function<bool_(const_TIntermNode_&)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (plVar4 == (long *)0x0) {
        if ((plVar3 == (long *)0x0) ||
           ((lVar7 = (**(code **)(*plVar3 + 0x20))(plVar3), *(int *)(lVar7 + 0xb8) != 0x35 &&
            (lVar7 = (**(code **)(*plVar3 + 0x20))(plVar3), *(int *)(lVar7 + 0xb8) != 0x33)))) {
          pp_Var9 = (this->super_TParseVersions)._vptr_TParseVersions;
          pcVar8 = "";
        }
        else {
          iVar2 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x18])(pTVar6);
          name = (TString *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 400))
                           ((long *)CONCAT44(extraout_var_02,iVar2));
          bVar1 = IsAnonymous(name);
          iVar2 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x18])(pTVar6);
          lVar7 = *(long *)CONCAT44(extraout_var_03,iVar2);
          if (bVar1) {
            lVar7 = (**(code **)(lVar7 + 0x1a0))();
          }
          else {
            lVar7 = (**(code **)(lVar7 + 400))((long *)CONCAT44(extraout_var_03,iVar2));
          }
          pcVar8 = *(char **)(lVar7 + 8);
          pp_Var9 = (this->super_TParseVersions)._vptr_TParseVersions;
        }
      }
      else {
        lVar7 = (**(code **)(*plVar4 + 400))(plVar4);
        pcVar8 = *(char **)(lVar7 + 8);
        pp_Var9 = (this->super_TParseVersions)._vptr_TParseVersions;
      }
      (*pp_Var9[0x2d])(this,loc,"can\'t read from writeonly object: ",op,pcVar8);
    }
  }
  return;
}

Assistant:

void TParseContextBase::rValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    if (! node)
        return;

    TIntermBinary* binaryNode = node->getAsBinaryNode();
    const TIntermSymbol* symNode = node->getAsSymbolNode();

    if (node->getQualifier().isWriteOnly()) {
        const TIntermTyped* leftMostTypeNode = TIntermediate::traverseLValueBase(node, true);

        if (symNode != nullptr)
            error(loc, "can't read from writeonly object: ", op, symNode->getName().c_str());
        else if (binaryNode &&
                (binaryNode->getAsOperator()->getOp() == EOpIndexDirectStruct ||
                 binaryNode->getAsOperator()->getOp() == EOpIndexDirect))
            if(IsAnonymous(leftMostTypeNode->getAsSymbolNode()->getName()))
                error(loc, "can't read from writeonly object: ", op, leftMostTypeNode->getAsSymbolNode()->getAccessName().c_str());
            else
                error(loc, "can't read from writeonly object: ", op, leftMostTypeNode->getAsSymbolNode()->getName().c_str());
        else
            error(loc, "can't read from writeonly object: ", op, "");

    } else {
        if (binaryNode) {
            switch (binaryNode->getOp()) {
            case EOpIndexDirect:
            case EOpIndexIndirect:
            case EOpIndexDirectStruct:
            case EOpVectorSwizzle:
            case EOpMatrixSwizzle:
                rValueErrorCheck(loc, op, binaryNode->getLeft());
                break;
            default:
                break;
            }
        }
    }
}